

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Warp.cpp
# Opt level: O2

void Handlers::Warp_Accept(Character *character,PacketReader *reader)

{
  WarpAnimation WVar1;
  Character *this;
  NPC *pNVar2;
  pointer psVar3;
  pointer ppCVar4;
  bool bVar5;
  int num;
  list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *plVar6;
  pointer ppCVar7;
  list<Character_*,_std::allocator<Character_*>_> *plVar8;
  pointer ppNVar9;
  _List_node_base *p_Var10;
  pointer ppNVar11;
  __shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2> *p_Var12;
  PacketBuilder reply;
  vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> updateitems;
  vector<NPC_*,_std::allocator<NPC_*>_> updatenpcs;
  vector<Character_*,_std::allocator<Character_*>_> updatecharacters;
  shared_ptr<Map_Item> item_1;
  
  WVar1 = character->warp_anim;
  if (WVar1 != 0xff) {
    character->warp_anim = WARP_ANIMATION_INVALID;
    updatecharacters.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    updatecharacters.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    updatecharacters.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    updateitems.
    super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    updateitems.
    super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    updateitems.
    super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    plVar8 = &character->map->characters;
    p_Var10 = (_List_node_base *)plVar8;
    while (p_Var10 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var10->_M_next)->
                     _M_impl)._M_node.super__List_node_base._M_next,
          p_Var10 != (_List_node_base *)plVar8) {
      reply._0_8_ = p_Var10[1]._M_next;
      bVar5 = Character::InRange((Character *)reply._0_8_,character);
      if (bVar5) {
        std::vector<Character_*,_std::allocator<Character_*>_>::push_back
                  (&updatecharacters,(value_type *)&reply);
      }
    }
    ppNVar11 = (character->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    for (ppNVar9 = (character->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppNVar9 != ppNVar11; ppNVar9 = ppNVar9 + 1) {
      reply._0_8_ = *ppNVar9;
      bVar5 = Character::InRange(character,(NPC *)reply._0_8_);
      if ((bVar5) && (*(char *)(reply._0_8_ + 0x10) == '\x01')) {
        std::vector<NPC_*,_std::allocator<NPC_*>_>::push_back(&updatenpcs,(value_type *)&reply);
      }
    }
    plVar6 = &character->map->items;
    p_Var10 = (_List_node_base *)plVar6;
    while (p_Var10 = (((_List_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                        *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var10 != (_List_node_base *)plVar6) {
      std::__shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2> *)&reply,
                 (__shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2> *)(p_Var10 + 1));
      bVar5 = Character::InRange(character,(Map_Item *)reply._0_8_);
      if (bVar5) {
        std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::
        push_back(&updateitems,(value_type *)&reply);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&reply.data);
    }
    PacketBuilder::PacketBuilder
              (&reply,PACKET_WARP,PACKET_AGREE,
               ((long)updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * 6 +
               ((long)updatecharacters.super__Vector_base<Character_*,_std::allocator<Character_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)updatecharacters.super__Vector_base<Character_*,_std::allocator<Character_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x3c +
               ((long)updateitems.
                      super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)updateitems.
                      super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 9 + 7);
    PacketBuilder::AddChar(&reply,2);
    PacketBuilder::AddShort(&reply,(int)character->mapid);
    PacketBuilder::AddChar(&reply,(uint)WVar1);
    PacketBuilder::AddChar
              (&reply,(int)((ulong)((long)updatecharacters.
                                          super__Vector_base<Character_*,_std::allocator<Character_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)updatecharacters.
                                         super__Vector_base<Character_*,_std::allocator<Character_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3));
    PacketBuilder::AddByte(&reply,0xff);
    ppCVar4 = updatecharacters.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl
              .super__Vector_impl_data._M_finish;
    for (ppCVar7 = updatecharacters.super__Vector_base<Character_*,_std::allocator<Character_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppNVar9 = updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                  super__Vector_impl_data._M_finish, ppCVar7 != ppCVar4; ppCVar7 = ppCVar7 + 1) {
      this = *ppCVar7;
      (*(this->super_Command_Source)._vptr_Command_Source[2])((string *)&item_1,this);
      PacketBuilder::AddBreakString(&reply,(string *)&item_1,0xff);
      std::__cxx11::string::~string((string *)&item_1);
      num = Character::PlayerID(this);
      PacketBuilder::AddShort(&reply,num);
      PacketBuilder::AddShort(&reply,(int)this->mapid);
      PacketBuilder::AddShort(&reply,(uint)this->x);
      PacketBuilder::AddShort(&reply,(uint)this->y);
      PacketBuilder::AddChar(&reply,(uint)this->direction);
      PacketBuilder::AddChar(&reply,6);
      Character::PaddedGuildTag_abi_cxx11_((string *)&item_1,this);
      PacketBuilder::AddString(&reply,(string *)&item_1);
      std::__cxx11::string::~string((string *)&item_1);
      PacketBuilder::AddChar(&reply,(uint)this->level);
      PacketBuilder::AddChar(&reply,(uint)this->gender);
      PacketBuilder::AddChar(&reply,(uint)this->hairstyle);
      PacketBuilder::AddChar(&reply,(uint)this->haircolor);
      PacketBuilder::AddChar(&reply,(uint)this->race);
      PacketBuilder::AddShort(&reply,this->maxhp);
      PacketBuilder::AddShort(&reply,this->hp);
      PacketBuilder::AddShort(&reply,this->maxtp);
      PacketBuilder::AddShort(&reply,this->tp);
      Character::AddPaperdollData(this,&reply,"B000A0HSW");
      PacketBuilder::AddChar(&reply,(uint)this->sitting);
      PacketBuilder::AddChar(&reply,this->hidden & 1);
      PacketBuilder::AddByte(&reply,0xff);
    }
    for (ppNVar11 = updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppNVar11 != ppNVar9; ppNVar11 = ppNVar11 + 1)
    {
      pNVar2 = *ppNVar11;
      PacketBuilder::AddChar(&reply,(uint)pNVar2->index);
      PacketBuilder::AddShort(&reply,pNVar2->id);
      PacketBuilder::AddChar(&reply,(uint)pNVar2->x);
      PacketBuilder::AddChar(&reply,(uint)pNVar2->y);
      PacketBuilder::AddChar(&reply,(uint)pNVar2->direction);
    }
    PacketBuilder::AddByte(&reply,0xff);
    psVar3 = updateitems.
             super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (p_Var12 = &(updateitems.
                     super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>;
        p_Var12 != &psVar3->super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>;
        p_Var12 = p_Var12 + 1) {
      std::__shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&item_1.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>,p_Var12);
      PacketBuilder::AddShort
                (&reply,(int)(item_1.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                             )->uid);
      PacketBuilder::AddShort
                (&reply,(int)(item_1.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                             )->id);
      PacketBuilder::AddChar
                (&reply,(uint)(item_1.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->x);
      PacketBuilder::AddChar
                (&reply,(uint)(item_1.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->y);
      PacketBuilder::AddThree
                (&reply,(item_1.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        amount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&item_1.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    Character::Send(character,&reply);
    PacketBuilder::~PacketBuilder(&reply);
    std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::~vector
              (&updateitems);
    std::_Vector_base<NPC_*,_std::allocator<NPC_*>_>::~_Vector_base
              (&updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>);
    std::_Vector_base<Character_*,_std::allocator<Character_*>_>::~_Vector_base
              (&updatecharacters.super__Vector_base<Character_*,_std::allocator<Character_*>_>);
  }
  return;
}

Assistant:

void Warp_Accept(Character *character, PacketReader &reader)
{
	//int map = reader.GetShort();
	(void)reader;

	int anim = character->warp_anim;

	// Removed (character->mapid == map) check as it interferes with fallback maps

	if (anim != WARP_ANIMATION_INVALID)
	{
		character->warp_anim = WARP_ANIMATION_INVALID;
	}
	else
	{
		return;
	}

	std::vector<Character *> updatecharacters;
	std::vector<NPC *> updatenpcs;
	std::vector<std::shared_ptr<Map_Item>> updateitems;

	UTIL_FOREACH(character->map->characters, checkcharacter)
	{
		if (checkcharacter->InRange(character))
		{
			updatecharacters.push_back(checkcharacter);
		}
	}

	UTIL_FOREACH(character->map->npcs, npc)
	{
		if (character->InRange(npc) && npc->alive)
		{
			updatenpcs.push_back(npc);
		}
	}

	UTIL_FOREACH(character->map->items, item)
	{
		if (character->InRange(*item))
		{
			updateitems.push_back(item);
		}
	}

	PacketBuilder reply(PACKET_WARP, PACKET_AGREE,
		7 + updatecharacters.size() * 60 + updatenpcs.size() * 6 + updateitems.size() * 9);

	reply.AddChar(2); // ?
	reply.AddShort(character->mapid);
	reply.AddChar(anim);
	reply.AddChar(updatecharacters.size());
	reply.AddByte(255);
	UTIL_FOREACH(updatecharacters, character)
	{
		reply.AddBreakString(character->SourceName());
		reply.AddShort(character->PlayerID());
		reply.AddShort(character->mapid);
		reply.AddShort(character->x);
		reply.AddShort(character->y);
		reply.AddChar(character->direction);
		reply.AddChar(6); // ?
		reply.AddString(character->PaddedGuildTag());
		reply.AddChar(character->level);
		reply.AddChar(character->gender);
		reply.AddChar(character->hairstyle);
		reply.AddChar(character->haircolor);
		reply.AddChar(character->race);
		reply.AddShort(character->maxhp);
		reply.AddShort(character->hp);
		reply.AddShort(character->maxtp);
		reply.AddShort(character->tp);
		// equipment
		character->AddPaperdollData(reply, "B000A0HSW");

		reply.AddChar(character->sitting);
		reply.AddChar(character->IsHideInvisible());
		reply.AddByte(255);
	}
	UTIL_FOREACH(updatenpcs, npc)
	{
		reply.AddChar(npc->index);
		reply.AddShort(npc->id);
		reply.AddChar(npc->x);
		reply.AddChar(npc->y);
		reply.AddChar(npc->direction);
	}
	reply.AddByte(255);
	UTIL_FOREACH(updateitems, item)
	{
		reply.AddShort(item->uid);
		reply.AddShort(item->id);
		reply.AddChar(item->x);
		reply.AddChar(item->y);
		reply.AddThree(item->amount);
	}
	character->Send(reply);
}